

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

void printKVData(ktx_uint8_t *pKvd,ktx_uint32_t kvdLen)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  _Bool _Var4;
  ktx_error_code_e kVar5;
  int iVar6;
  char *pcVar7;
  uint in_ESI;
  ktxHashList *in_RDI;
  ktx_uint32_t i;
  ktx_uint32_t number;
  ktx_uint8_t faces;
  ktx_uint32_t loopCount;
  ktx_uint32_t timescale;
  ktx_uint32_t duration;
  ktx_uint32_t glType;
  ktx_uint32_t glFormat;
  ktx_uint32_t glInternalformat;
  ktx_uint32_t valueLen;
  ktx_uint32_t keyLen;
  char *value;
  char *key;
  ktxHashListEntry *entry;
  int entryIndex;
  ktxHashList kvDataHead;
  ktx_error_code_e result;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint *local_38;
  char *local_30;
  ktxHashListEntry *local_28;
  int local_1c;
  
  local_28 = (ktxHashListEntry *)0x0;
  if ((in_RDI != (ktxHashList *)0x0) && (in_ESI != 0)) {
    kVar5 = ktxHashList_Deserialize(in_RDI,in_ESI,(void *)0x0);
    if (kVar5 == KTX_SUCCESS) {
      if (local_28 != (ktxHashListEntry *)0x0) {
        local_1c = 0;
        while( true ) {
          uVar1 = in_stack_ffffffffffffff98 & 0xffffff;
          if (local_28 != (ktxHashListEntry *)0x0) {
            uVar1 = CONCAT13(local_1c < 100,(int3)in_stack_ffffffffffffff98);
          }
          in_stack_ffffffffffffff98 = uVar1;
          if ((char)(in_stack_ffffffffffffff98 >> 0x18) == '\0') break;
          ktxHashListEntry_GetKey(local_28,(uint *)&stack0xffffffffffffffc4,&local_30);
          ktxHashListEntry_GetValue(local_28,(uint *)&stack0xffffffffffffffc0,&local_38);
          fprintf(_stdout,"%s:",local_30);
          if (local_38 == (uint *)0x0) {
            fprintf(_stdout," null\n");
          }
          else {
            iVar6 = strcmp(local_30,"KTXglFormat");
            if (iVar6 == 0) {
              if (in_stack_ffffffffffffffc0 == 0xc) {
                uVar1 = *local_38;
                uVar2 = local_38[1];
                uVar3 = local_38[2];
                fprintf(_stdout,"\n");
                fprintf(_stdout,"    glInternalformat: 0x%08X\n",(ulong)uVar1);
                fprintf(_stdout,"    glFormat: 0x%08X\n",(ulong)uVar2);
                fprintf(_stdout,"    glType: 0x%08X\n",(ulong)uVar3);
              }
            }
            else {
              iVar6 = strcmp(local_30,"KTXanimData");
              if (iVar6 == 0) {
                if (in_stack_ffffffffffffffc0 == 0xc) {
                  uVar1 = *local_38;
                  uVar2 = local_38[1];
                  uVar3 = local_38[2];
                  fprintf(_stdout,"\n");
                  fprintf(_stdout,"    duration: %u\n",(ulong)uVar1);
                  fprintf(_stdout,"    timescale: %u\n",(ulong)uVar2);
                  pcVar7 = "";
                  if (uVar3 == 0) {
                    pcVar7 = " (infinite)";
                  }
                  fprintf(_stdout,"    loopCount: %u%s\n",(ulong)uVar3,pcVar7);
                }
              }
              else {
                iVar6 = strcmp(local_30,"KTXcubemapIncomplete");
                if (iVar6 == 0) {
                  if (in_stack_ffffffffffffffc0 == 1) {
                    uVar1 = *local_38;
                    fprintf(_stdout,"\n");
                    pcVar7 = "false";
                    if ((uVar1 & 1) != 0) {
                      pcVar7 = "true";
                    }
                    fprintf(_stdout,"    positiveX: %s\n",pcVar7);
                    pcVar7 = "false";
                    if ((uVar1 & 2) != 0) {
                      pcVar7 = "true";
                    }
                    fprintf(_stdout,"    negativeX: %s\n",pcVar7);
                    pcVar7 = "false";
                    if ((uVar1 & 4) != 0) {
                      pcVar7 = "true";
                    }
                    fprintf(_stdout,"    positiveY: %s\n",pcVar7);
                    pcVar7 = "false";
                    if ((uVar1 & 8) != 0) {
                      pcVar7 = "true";
                    }
                    fprintf(_stdout,"    negativeY: %s\n",pcVar7);
                    pcVar7 = "false";
                    if ((uVar1 & 0x10) != 0) {
                      pcVar7 = "true";
                    }
                    fprintf(_stdout,"    positiveZ: %s\n",pcVar7);
                    pcVar7 = "false";
                    if ((uVar1 & 0x20) != 0) {
                      pcVar7 = "true";
                    }
                    fprintf(_stdout,"    negativeZ: %s\n",pcVar7);
                  }
                }
                else {
                  _Var4 = isKnownKeyValueUINT32
                                    ((char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                      in_stack_ffffffffffffff98));
                  if (_Var4) {
                    if (in_stack_ffffffffffffffc0 == 4) {
                      fprintf(_stdout," %u\n",(ulong)*local_38);
                    }
                  }
                  else {
                    _Var4 = isKnownKeyValueString
                                      ((char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                        in_stack_ffffffffffffff98));
                    if (_Var4) {
                      if (*(byte *)((long)local_38 + (ulong)(in_stack_ffffffffffffffc0 - 1)) == 0) {
                        fprintf(_stdout," %s\n",local_38);
                      }
                    }
                    else {
                      fprintf(_stdout," [");
                      for (in_stack_ffffffffffffff9c = 0;
                          in_stack_ffffffffffffff9c < in_stack_ffffffffffffffc0;
                          in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1) {
                        pcVar7 = ", ";
                        if (in_stack_ffffffffffffff9c + 1 == in_stack_ffffffffffffffc0) {
                          pcVar7 = "";
                        }
                        fprintf(_stdout,"%d%s",
                                (ulong)(uint)(int)(char)*(byte *)((long)local_38 +
                                                                 (ulong)in_stack_ffffffffffffff9c),
                                pcVar7);
                      }
                      fprintf(_stdout,"]\n");
                    }
                  }
                }
              }
            }
          }
          local_28 = ktxHashList_Next(local_28);
          local_1c = local_1c + 1;
        }
        ktxHashList_Destruct
                  ((ktxHashList *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      }
    }
    else {
      fprintf(_stdout,"Failed to parse or not enough memory to build list of key/value pairs.\n");
    }
    return;
  }
  __assert_fail("pKvd != NULL && kvdLen > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/info.c"
                ,0x8b,"void printKVData(ktx_uint8_t *, ktx_uint32_t)");
}

Assistant:

void
printKVData(ktx_uint8_t* pKvd, ktx_uint32_t kvdLen)
{
    KTX_error_code result;
    ktxHashList kvDataHead = 0;

    assert(pKvd != NULL && kvdLen > 0);

    result = ktxHashList_Deserialize(&kvDataHead, kvdLen, pKvd);
    if (result != KTX_SUCCESS) {
        fprintf(stdout, "Failed to parse or not enough memory to build list of key/value pairs.\n");
        return;
    }

    if (kvDataHead == NULL)
        return;

    int entryIndex = 0;
    ktxHashListEntry* entry = kvDataHead;
    for (; entry != NULL && entryIndex < MAX_NUM_KVD_ENTRIES; entry = ktxHashList_Next(entry), ++entryIndex) {
        char* key;
        char* value;
        ktx_uint32_t keyLen, valueLen;

        ktxHashListEntry_GetKey(entry, &keyLen, &key);
        ktxHashListEntry_GetValue(entry, &valueLen, (void**)&value);
        // Keys must be NUL terminated.
        fprintf(stdout, "%s:", key);
        if (!value) {
            fprintf(stdout, " null\n");

        } else {
            if (strcmp(key, "KTXglFormat") == 0) {
                if (valueLen == 3 * sizeof(ktx_uint32_t)) {
                    ktx_uint32_t glInternalformat = *(const ktx_uint32_t*) (value + 0);
                    ktx_uint32_t glFormat = *(const ktx_uint32_t*) (value + 4);
                    ktx_uint32_t glType = *(const ktx_uint32_t*) (value + 8);
                    fprintf(stdout, "\n");
                    fprintf(stdout, "    glInternalformat: 0x%08X\n", glInternalformat);
                    fprintf(stdout, "    glFormat: 0x%08X\n", glFormat);
                    fprintf(stdout, "    glType: 0x%08X\n", glType);
                }

            } else if (strcmp(key, "KTXanimData") == 0) {
                if (valueLen == 3 * sizeof(ktx_uint32_t)) {
                    ktx_uint32_t duration = *(const ktx_uint32_t*) (value + 0);
                    ktx_uint32_t timescale = *(const ktx_uint32_t*) (value + 4);
                    ktx_uint32_t loopCount = *(const ktx_uint32_t*) (value + 8);
                    fprintf(stdout, "\n");
                    fprintf(stdout, "    duration: %u\n", duration);
                    fprintf(stdout, "    timescale: %u\n", timescale);
                    fprintf(stdout, "    loopCount: %u%s\n", loopCount, loopCount == 0 ? " (infinite)" : "");
                }

            } else if (strcmp(key, "KTXcubemapIncomplete") == 0) {
                if (valueLen == sizeof(ktx_uint8_t)) {
                    ktx_uint8_t faces = *value;
                    fprintf(stdout, "\n");
                    fprintf(stdout, "    positiveX: %s\n", faces & 1u << 0u ? "true" : "false");
                    fprintf(stdout, "    negativeX: %s\n", faces & 1u << 1u ? "true" : "false");
                    fprintf(stdout, "    positiveY: %s\n", faces & 1u << 2u ? "true" : "false");
                    fprintf(stdout, "    negativeY: %s\n", faces & 1u << 3u ? "true" : "false");
                    fprintf(stdout, "    positiveZ: %s\n", faces & 1u << 4u ? "true" : "false");
                    fprintf(stdout, "    negativeZ: %s\n", faces & 1u << 5u ? "true" : "false");
                }

            } else if (isKnownKeyValueUINT32(key)) {
                if (valueLen == sizeof(ktx_uint32_t)) {
                    ktx_uint32_t number = *(const ktx_uint32_t*) value;
                    fprintf(stdout, " %u\n", number);
                }

            } else if (isKnownKeyValueString(key)) {
                if (value[valueLen-1] == '\0') {
                    fprintf(stdout, " %s\n", value);
                }

            } else {
                fprintf(stdout, " [");
                for (ktx_uint32_t i = 0; i < valueLen; i++)
                    fprintf(stdout, "%d%s", (int) value[i], i + 1 == valueLen ? "" : ", ");
                fprintf(stdout, "]\n");
            }
        }
    }

    ktxHashList_Destruct(&kvDataHead);
}